

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMonitor.cpp
# Opt level: O2

uint __thiscall MemoryMonitor::getTotalMemory(MemoryMonitor *this)

{
  _func_int **pp_Var1;
  int iVar2;
  ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::PtrHasher> *this_00;
  undefined4 extraout_var;
  uint uVar3;
  
  this_00 = (ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::PtrHasher> *)operator_new(0x28);
  uVar3 = 0;
  ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::PtrHasher>::ValueHashTableOfEnumerator
            (this_00,this->fHashTable,false);
  while( true ) {
    iVar2 = (*(this_00->super_XMLEnumerator<unsigned_int>)._vptr_XMLEnumerator[2])(this_00);
    pp_Var1 = (this_00->super_XMLEnumerator<unsigned_int>)._vptr_XMLEnumerator;
    if ((char)iVar2 == '\0') break;
    iVar2 = (*pp_Var1[3])(this_00);
    uVar3 = uVar3 + *(int *)CONCAT44(extraout_var,iVar2);
  }
  (*pp_Var1[1])(this_00);
  return uVar3;
}

Assistant:

unsigned int MemoryMonitor::getTotalMemory()
{
    unsigned int total = 0;
    ValueHashTableOfEnumerator<unsigned int> *memEnum =
            new ValueHashTableOfEnumerator<unsigned int>(fHashTable);
    while(memEnum->hasMoreElements()) {
        total += memEnum->nextElement();
    }
    delete memEnum;
    return total;
}